

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bag.h
# Opt level: O2

PreprocessorOptions * __thiscall
slang::Bag::getOrDefault<slang::parsing::PreprocessorOptions>
          (PreprocessorOptions *__return_storage_ptr__,Bag *this)

{
  PreprocessorOptions *pPVar1;
  
  pPVar1 = get<slang::parsing::PreprocessorOptions>(this);
  if (pPVar1 == (PreprocessorOptions *)0x0) {
    memset(__return_storage_ptr__,0,0xa0);
    parsing::PreprocessorOptions::PreprocessorOptions(__return_storage_ptr__);
  }
  else {
    parsing::PreprocessorOptions::PreprocessorOptions(__return_storage_ptr__,pPVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

T getOrDefault() const {
        const T* result = get<T>();
        if (result)
            return *result;
        return T();
    }